

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutex.cc
# Opt level: O0

bool __thiscall absl::lts_20240722::Mutex::TryLock(Mutex *this)

{
  bool bVar1;
  __atomic_base<long> local_68;
  intptr_t v;
  Mutex *this_local;
  ulong local_50;
  memory_order local_48;
  int local_44;
  memory_order __b;
  undefined1 local_31;
  ulong local_30;
  undefined4 local_28;
  undefined4 local_24;
  ulong local_20;
  __atomic_base<long> *local_18;
  Mutex *local_10;
  
  local_44 = 0;
  v = (intptr_t)this;
  ___b = this;
  local_48 = std::operator&(memory_order_relaxed,__memory_order_mask);
  if (local_44 - 1U < 2) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else if (local_44 == 5) {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  else {
    local_50 = (this->mu_).super___atomic_base<long>._M_i;
  }
  local_68._M_i = local_50;
  if ((local_50 & 0x19) == 0) {
    local_30 = local_50 | 8;
    local_18 = &local_68;
    local_24 = 2;
    local_28 = 0;
    LOCK();
    local_31 = local_50 == (this->mu_).super___atomic_base<long>._M_i;
    if ((bool)local_31) {
      (this->mu_).super___atomic_base<long>._M_i = local_30;
    }
    UNLOCK();
    if ((bool)local_31) {
      local_20 = local_30;
      local_10 = this;
      DebugOnlyLockEnter(this);
      return true;
    }
  }
  else if ((local_50 & 0x10) != 0) {
    bVar1 = TryLockSlow(this);
    return bVar1;
  }
  return false;
}

Assistant:

bool Mutex::TryLock() {
  ABSL_TSAN_MUTEX_PRE_LOCK(this, __tsan_mutex_try_lock);
  intptr_t v = mu_.load(std::memory_order_relaxed);
  // Try fast acquire.
  if (ABSL_PREDICT_TRUE((v & (kMuWriter | kMuReader | kMuEvent)) == 0)) {
    if (ABSL_PREDICT_TRUE(mu_.compare_exchange_strong(
            v, kMuWriter | v, std::memory_order_acquire,
            std::memory_order_relaxed))) {
      DebugOnlyLockEnter(this);
      ABSL_TSAN_MUTEX_POST_LOCK(this, __tsan_mutex_try_lock, 0);
      return true;
    }
  } else if (ABSL_PREDICT_FALSE((v & kMuEvent) != 0)) {
    // We're recording events.
    return TryLockSlow();
  }
  ABSL_TSAN_MUTEX_POST_LOCK(
      this, __tsan_mutex_try_lock | __tsan_mutex_try_lock_failed, 0);
  return false;
}